

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

bool __thiscall
wasm::OptimizeInstructions::trapOnNull(OptimizeInstructions *this,Expression *curr,Expression **ref)

{
  Expression *pEVar1;
  ulong uVar2;
  PassRunner *pPVar3;
  bool bVar4;
  bool bVar5;
  Index IVar6;
  Drop *pDVar7;
  HeapType HVar8;
  Expression *pEVar9;
  Block *pBVar10;
  Drop *pDVar11;
  ulong in_RCX;
  Expression ***pppEVar12;
  Module *wasm;
  Expression **ppEVar13;
  int iVar14;
  Index index;
  bool bVar15;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  anon_class_8_1_8991fb9c local_200;
  anon_class_8_1_8991fb9c flowsOutNull;
  bool local_1ec;
  bool local_11d;
  size_t local_d8;
  size_t local_a8;
  AbstractChildIterator<wasm::ChildIterator> local_a0;
  Expression *local_60;
  Expression *local_58;
  OptimizeInstructions *local_50;
  Expression *local_48;
  Expression **local_40;
  Builder local_38;
  Builder builder;
  
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  local_40 = ref;
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).trapsNeverHappen == true) {
    pEVar9 = *ref;
    local_200.this = this;
    if ((pEVar9->_id == IfId) && (*(long *)(pEVar9 + 2) != 0)) {
      bVar5 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        (&stack0xfffffffffffffe00,(Expression *)pEVar9[1].type.id);
      if (bVar5) {
        wasm = *(Module **)(pEVar9 + 2);
        if ((pointer)((*local_40)->type).id !=
            (wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this->refinalize = true;
        }
        pEVar1 = *(Expression **)(pEVar9 + 1);
        pDVar7 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar7->value = pEVar1;
        Drop::finalize(pDVar7);
        pEVar9 = *(Expression **)(pEVar9 + 2);
      }
      else {
        bVar5 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                          (&stack0xfffffffffffffe00,*(Expression **)(pEVar9 + 2));
        if (!bVar5) goto LAB_009f560d;
        wasm = (Module *)pEVar9[1].type.id;
        if ((pointer)((*local_40)->type).id !=
            (wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this->refinalize = true;
        }
        pEVar1 = *(Expression **)(pEVar9 + 1);
        pDVar7 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar7->value = pEVar1;
        Drop::finalize(pDVar7);
        pEVar9 = (Expression *)pEVar9[1].type.id;
      }
LAB_009f5956:
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)wasm;
      pBVar10 = Builder::makeSequence(&local_38,(Expression *)pDVar7,pEVar9,type);
    }
    else {
LAB_009f560d:
      pEVar9 = *local_40;
      if (pEVar9->_id != SelectId) goto LAB_009f5663;
      bVar5 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        (&stack0xfffffffffffffe00,*(Expression **)(pEVar9 + 1));
      if ((bVar5) && (*(long *)(pEVar9[1].type.id + 8) != 1)) {
        pEVar1 = *(Expression **)(pEVar9 + 1);
        pDVar7 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar7->value = pEVar1;
        Drop::finalize(pDVar7);
        pEVar1 = (Expression *)pEVar9[1].type.id;
        pEVar9 = *(Expression **)(pEVar9 + 2);
        pDVar11 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pDVar11->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar11->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar11->value = pEVar9;
        Drop::finalize(pDVar11);
        wasm = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule;
        pEVar9 = getResultOfFirst(pEVar1,(Expression *)pDVar11,
                                  (this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .currFunction,wasm,
                                  &((this->
                                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                    ).super_Pass.runner)->options);
        goto LAB_009f5956;
      }
      bVar5 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                        (&stack0xfffffffffffffe00,(Expression *)pEVar9[1].type.id);
      if ((!bVar5) || (pEVar1 = *(Expression **)(pEVar9 + 1), (pEVar1->type).id == 1))
      goto LAB_009f5663;
      local_48 = (Expression *)pEVar9[1].type.id;
      pDVar7 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar7->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar7->value = local_48;
      Drop::finalize(pDVar7);
      pEVar9 = *(Expression **)(pEVar9 + 2);
      pDVar11 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      (pDVar11->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar11->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar11->value = pEVar9;
      Drop::finalize(pDVar11);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
      pBVar10 = Builder::makeSequence(&local_38,(Expression *)pDVar7,(Expression *)pDVar11,type_00);
      pBVar10 = (Block *)getResultOfFirst(pEVar1,(Expression *)pBVar10,
                                          (this->
                                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .
                                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .currFunction,
                                          (this->
                                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .
                                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .currModule,
                                          &((this->
                                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                            ).super_Pass.runner)->options);
    }
    *local_40 = (Expression *)pBVar10;
    bVar5 = false;
  }
  else {
LAB_009f5663:
    ppEVar13 = local_40;
    pEVar9 = *local_40;
    uVar2 = (pEVar9->type).id;
    if ((((uint)uVar2 & 3) == 2 && 6 < uVar2) && (pEVar9->_id == RefCastId)) {
      local_60 = curr;
      local_58 = pEVar9;
      local_50 = this;
      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a0,curr);
      iVar14 = (int)((ulong)((long)local_a0.children.flexible.
                                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a0.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
               (int)local_a0.children.usedFixed;
      if (iVar14 == 0) {
        bVar5 = true;
      }
      else {
        bVar4 = true;
        bVar5 = true;
        local_48 = (Expression *)((ulong)local_48 & 0xffffffff00000000);
        index = 0;
        do {
          IVar6 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_a0,index);
          pppEVar12 = local_a0.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar6 - 4);
          if (IVar6 < 4) {
            pppEVar12 = local_a0.children.fixed._M_elems + IVar6;
          }
          pEVar9 = **pppEVar12;
          if (pEVar9 == *ppEVar13) {
            bVar15 = false;
            local_48 = (Expression *)
                       CONCAT44(local_48._4_4_,(int)CONCAT71((int7)((ulong)*pppEVar12 >> 8),1));
          }
          else if (((ulong)local_48 & 1) == 0) {
            bVar15 = false;
          }
          else {
            pPVar3 = (local_50->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner;
            bVar5 = (pPVar3->options).trapsNeverHappen;
            bVar15 = true;
            if ((((bVar5 == true) &&
                 (EffectAnalyzer::EffectAnalyzer
                            ((EffectAnalyzer *)&stack0xfffffffffffffe00,&pPVar3->options,
                             (local_50->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,pEVar9), local_1ec == false)) && (local_11d == false)) &&
               (local_a8 == 0)) {
              bVar15 = local_d8 != 0;
            }
            if (bVar5 != false) {
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&stack0xffffffffffffff30);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&stack0xffffffffffffff00);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&stack0xfffffffffffffea8);
              std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                           *)&stack0xfffffffffffffe78);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&stack0xfffffffffffffe48);
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&stack0xfffffffffffffe18);
            }
            ppEVar13 = local_40;
            bVar5 = bVar4;
            if (bVar15) {
              bVar5 = false;
              bVar4 = bVar5;
            }
          }
        } while ((!bVar15) && (bVar15 = iVar14 - 1U != index, index = index + 1, bVar15));
      }
      pEVar9 = local_58;
      curr = local_60;
      if (local_a0.children.flexible.
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.children.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this = local_50;
      if (bVar5) {
        HVar8 = wasm::Type::getHeapType(&pEVar9->type);
        if (((uint)(0x7c < HVar8.id) * 4 + 3 & (uint)HVar8.id) != 0) {
          __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
        }
        (pEVar9->type).id = HVar8.id;
      }
    }
    pEVar9 = getFallthrough(this,*ppEVar13);
    bVar5 = wasm::Type::isNull(&pEVar9->type);
    if (bVar5) {
      pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
      pEVar9->_id = UnreachableId;
      (pEVar9->type).id = 1;
      pEVar9 = wasm::getDroppedChildrenAndAppend
                         (curr,(this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule,
                          &((this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).super_Pass.runner)->options,pEVar9,NoticeParentEffects);
      replaceCurrent(this,pEVar9);
    }
  }
  return bVar5;
}

Assistant:

bool trapOnNull(Expression* curr, Expression*& ref) {
    Builder builder(*getModule());

    if (getPassOptions().trapsNeverHappen) {
      // We can ignore the possibility of the reference being an input, so
      //
      //    (if
      //      (condition)
      //      (null)
      //      (other))
      // =>
      //    (drop
      //      (condition))
      //    (other)
      //
      // That is, we will by assumption not read from the null, so remove that
      // arm.
      //
      // TODO We could recurse here.
      // TODO We could do similar things for casts (rule out an impossible arm).
      // TODO Worth thinking about an 'assume' instrinsic of some form that
      //      annotates knowledge about a value, or another mechanism to allow
      //      that information to be passed around.

      // Note that we must check that the null is actually flowed out, that is,
      // that control flow is not transferred before:
      //
      //    (if
      //      (1)
      //      (block (result null)
      //        (return)
      //      )
      //      (other))
      //
      // The true arm has a bottom type, but in fact it just returns out of the
      // function and the null does not actually flow out. We can only optimize
      // here if a null definitely flows out (as only that would cause a trap).
      auto flowsOutNull = [&](Expression* child) {
        return child->type.isNull() && !effects(child).transfersControlFlow();
      };

      if (auto* iff = ref->dynCast<If>()) {
        if (iff->ifFalse) {
          if (flowsOutNull(iff->ifTrue)) {
            if (ref->type != iff->ifFalse->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifFalse);
            return false;
          }
          if (flowsOutNull(iff->ifFalse)) {
            if (ref->type != iff->ifTrue->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifTrue);
            return false;
          }
        }
      }

      if (auto* select = ref->dynCast<Select>()) {
        // We must check for unreachability explicitly here because a full
        // refinalize only happens at the end. That is, the select may stil be
        // reachable after we turned one child into an unreachable, and we are
        // calling getResultOfFirst which will error on unreachability.
        if (flowsOutNull(select->ifTrue) &&
            select->ifFalse->type != Type::unreachable) {
          ref = builder.makeSequence(
            builder.makeDrop(select->ifTrue),
            getResultOfFirst(select->ifFalse,
                             builder.makeDrop(select->condition)));
          return false;
        }
        if (flowsOutNull(select->ifFalse) &&
            select->ifTrue->type != Type::unreachable) {
          ref = getResultOfFirst(
            select->ifTrue,
            builder.makeSequence(builder.makeDrop(select->ifFalse),
                                 builder.makeDrop(select->condition)));
          return false;
        }
      }
    }

    // A nullable cast can be turned into a non-nullable one:
    //
    //    (struct.get ;; or something else that traps on a null ref
    //      (ref.cast null
    // =>
    //    (struct.get
    //      (ref.cast      ;; now non-nullable
    //
    // Either way we trap here, but refining the type may have benefits later.
    if (ref->type.isNullable()) {
      if (auto* cast = ref->dynCast<RefCast>()) {
        // Note that we must be the last child of the parent, otherwise effects
        // in the middle may need to remain:
        //
        //    (struct.set
        //      (ref.cast null
        //      (call ..
        //
        // The call here must execute before the trap in the struct.set. To
        // avoid that problem, inspect all children after us. If there are no
        // such children, then there is no problem; if there are, see below.
        auto canOptimize = true;
        auto seenRef = false;
        for (auto* child : ChildIterator(curr)) {
          if (child == ref) {
            seenRef = true;
          } else if (seenRef) {
            // This is a child after the reference. Check it for effects. For
            // simplicity, focus on the case of traps-never-happens: if we can
            // assume no trap occurs in the parent, then there must not be a
            // trap in the child either, unless control flow transfers and we
            // might not reach the parent.
            // TODO: handle more cases.
            if (!getPassOptions().trapsNeverHappen ||
                effects(child).transfersControlFlow()) {
              canOptimize = false;
              break;
            }
          }
        }
        if (canOptimize) {
          cast->type = Type(cast->type.getHeapType(), NonNullable);
        }
      }
    }

    auto fallthrough = getFallthrough(ref);

    if (fallthrough->type.isNull()) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, builder.makeUnreachable()));
      return true;
    }
    return false;
  }